

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  N_Vector Xv [3];
  sunrealtype cv [3];
  int status;
  int *nli;
  sunrealtype *res_norm;
  SUNPSolveFn psolve;
  SUNATimesFn atimes;
  N_Vector sb;
  N_Vector sx;
  void *P_data;
  void *A_data;
  int l_max;
  int l;
  int *zeroguess;
  int converged;
  int scale_b;
  int scale_x;
  int preOnRight;
  int preOnLeft;
  N_Vector vtemp;
  N_Vector Ap;
  N_Vector u;
  N_Vector q;
  N_Vector p;
  N_Vector r;
  N_Vector r_star;
  sunrealtype rho;
  sunrealtype r_norm;
  sunrealtype beta_denom;
  sunrealtype beta_num;
  sunrealtype omega_denom;
  sunrealtype omega;
  sunrealtype beta;
  sunrealtype alpha;
  SUNContext_conflict sunctx_local_scope_;
  double local_170;
  double local_168;
  bool local_15a;
  bool local_159;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  double local_138;
  double local_130;
  double local_128;
  int local_11c;
  int *local_118;
  double *local_110;
  code *local_108;
  code *local_100;
  long local_f8;
  long local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  int local_d8;
  int local_d4;
  int *local_d0;
  int local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  double local_30;
  undefined8 local_28;
  undefined8 local_20;
  long *local_10;
  int local_4;
  
  local_38 = in_RDI[2];
  local_d8 = *(int *)*in_RDI;
  local_80 = *(undefined8 *)(*in_RDI + 0x60);
  local_88 = *(undefined8 *)(*in_RDI + 0x58);
  local_90 = *(undefined8 *)(*in_RDI + 0x68);
  local_98 = *(undefined8 *)(*in_RDI + 0x70);
  local_a0 = *(undefined8 *)(*in_RDI + 0x78);
  local_a8 = *(undefined8 *)(*in_RDI + 0x80);
  local_b0 = *(undefined8 *)(*in_RDI + 0x88);
  local_f8 = *(long *)(*in_RDI + 0x48);
  local_f0 = *(long *)(*in_RDI + 0x50);
  local_e0 = *(undefined8 *)(*in_RDI + 0x28);
  local_e8 = *(undefined8 *)(*in_RDI + 0x40);
  local_100 = *(code **)(*in_RDI + 0x20);
  local_108 = *(code **)(*in_RDI + 0x38);
  local_d0 = (int *)(*in_RDI + 8);
  local_118 = (int *)(*in_RDI + 0xc);
  local_110 = (double *)(*in_RDI + 0x10);
  *local_118 = 0;
  local_c4 = 0;
  local_159 = true;
  if (*(int *)(*in_RDI + 4) != 1) {
    local_159 = *(int *)(*in_RDI + 4) == 3;
  }
  local_b4 = (uint)local_159;
  local_15a = true;
  if (*(int *)(*in_RDI + 4) != 2) {
    local_15a = *(int *)(*in_RDI + 4) == 3;
  }
  local_b8 = (uint)local_15a;
  local_bc = (uint)(local_f0 != 0);
  local_c0 = (uint)(local_f8 != 0);
  if ((local_b8 == 0) || (*local_d0 != 0)) {
    local_30 = in_XMM0_Qa;
    local_20 = in_RDX;
    local_10 = in_RDI;
    if (*local_d0 == 0) {
      local_28 = in_RCX;
      local_11c = (*local_100)(local_e0,in_RDX,local_80);
      if (local_11c != 0) {
        *local_d0 = 0;
        uVar2 = 0x323;
        if (local_11c < 0) {
          uVar2 = 0xfffffcdb;
        }
        *(undefined4 *)(*local_10 + 0x18) = uVar2;
        return *(int *)(*local_10 + 0x18);
      }
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,local_28,local_80,local_80);
    }
    else {
      N_VScale(0x3ff0000000000000,in_RCX,local_80);
    }
    if (local_b4 == 0) {
      N_VScale(0x3ff0000000000000,local_80,local_88);
    }
    else {
      iVar1 = (*local_108)(local_30,local_e8,local_80,local_88,1);
      if (iVar1 != 0) {
        *local_d0 = 0;
        uVar2 = 0x325;
        if (iVar1 < 0) {
          uVar2 = 0xfffffcd8;
        }
        *(undefined4 *)(*local_10 + 0x18) = uVar2;
        return *(int *)(*local_10 + 0x18);
      }
      local_11c = 0;
    }
    if (local_c0 == 0) {
      N_VScale(0x3ff0000000000000,local_88,local_80);
    }
    else {
      N_VProd(local_f8,local_88,local_80);
    }
    local_68 = (double)N_VDotProd(local_80,local_80);
    if (0.0 < local_68) {
      local_168 = sqrt(local_68);
    }
    else {
      local_168 = 0.0;
    }
    local_78 = local_168;
    local_70 = local_168;
    *local_110 = local_168;
    if (local_30 < local_168) {
      N_VScale(0x3ff0000000000000,local_80,local_88);
      N_VScale(0x3ff0000000000000,local_80,local_90);
      if ((local_bc != 0) && (*local_d0 == 0)) {
        N_VProd(local_f0,local_20,local_20);
      }
      for (local_d4 = 0; local_d4 < local_d8; local_d4 = local_d4 + 1) {
        *local_118 = *local_118 + 1;
        if (local_bc == 0) {
          N_VScale(0x3ff0000000000000,local_90,local_b0);
        }
        else {
          N_VDiv(local_90,local_f0,local_b0);
        }
        if (local_b8 != 0) {
          N_VScale(0x3ff0000000000000,local_b0,local_a8);
          iVar1 = (*local_108)(local_30,local_e8,local_a8,local_b0,2);
          if (iVar1 != 0) {
            *local_d0 = 0;
            uVar2 = 0x325;
            if (iVar1 < 0) {
              uVar2 = 0xfffffcd8;
            }
            *(undefined4 *)(*local_10 + 0x18) = uVar2;
            return *(int *)(*local_10 + 0x18);
          }
          local_11c = 0;
        }
        local_11c = (*local_100)(local_e0,local_b0,local_a8);
        if (local_11c != 0) {
          *local_d0 = 0;
          uVar2 = 0x323;
          if (local_11c < 0) {
            uVar2 = 0xfffffcdb;
          }
          *(undefined4 *)(*local_10 + 0x18) = uVar2;
          return *(int *)(*local_10 + 0x18);
        }
        if (local_b4 == 0) {
          N_VScale(0x3ff0000000000000,local_a8,local_b0);
        }
        else {
          iVar1 = (*local_108)(local_30,local_e8,local_a8,local_b0,1);
          if (iVar1 != 0) {
            *local_d0 = 0;
            uVar2 = 0x325;
            if (iVar1 < 0) {
              uVar2 = 0xfffffcd8;
            }
            *(undefined4 *)(*local_10 + 0x18) = uVar2;
            return *(int *)(*local_10 + 0x18);
          }
          local_11c = 0;
        }
        if (local_c0 == 0) {
          N_VScale(0x3ff0000000000000,local_b0,local_a8);
        }
        else {
          N_VProd(local_f8,local_b0,local_a8);
        }
        local_40 = (double)N_VDotProd(local_a8,local_80);
        local_40 = local_68 / local_40;
        N_VLinearSum(0x3ff0000000000000,-local_40,local_88,local_a8,local_98);
        if (local_bc == 0) {
          N_VScale(0x3ff0000000000000,local_98,local_b0);
        }
        else {
          N_VDiv(local_98,local_f0,local_b0);
        }
        if (local_b8 != 0) {
          N_VScale(0x3ff0000000000000,local_b0,local_a0);
          iVar1 = (*local_108)(local_30,local_e8,local_a0,local_b0,2);
          if (iVar1 != 0) {
            *local_d0 = 0;
            uVar2 = 0x325;
            if (iVar1 < 0) {
              uVar2 = 0xfffffcd8;
            }
            *(undefined4 *)(*local_10 + 0x18) = uVar2;
            return *(int *)(*local_10 + 0x18);
          }
          local_11c = 0;
        }
        local_11c = (*local_100)(local_e0,local_b0,local_a0);
        if (local_11c != 0) {
          *local_d0 = 0;
          uVar2 = 0x323;
          if (local_11c < 0) {
            uVar2 = 0xfffffcdb;
          }
          *(undefined4 *)(*local_10 + 0x18) = uVar2;
          return *(int *)(*local_10 + 0x18);
        }
        if (local_b4 == 0) {
          N_VScale(0x3ff0000000000000,local_a0,local_b0);
        }
        else {
          iVar1 = (*local_108)(local_30,local_e8,local_a0,local_b0,1);
          if (iVar1 != 0) {
            *local_d0 = 0;
            uVar2 = 0x325;
            if (iVar1 < 0) {
              uVar2 = 0xfffffcd8;
            }
            *(undefined4 *)(*local_10 + 0x18) = uVar2;
            return *(int *)(*local_10 + 0x18);
          }
          local_11c = 0;
        }
        if (local_c0 == 0) {
          N_VScale(0x3ff0000000000000,local_b0,local_a0);
        }
        else {
          N_VProd(local_f8,local_b0,local_a0);
        }
        local_58 = (double)N_VDotProd(local_a0,local_a0);
        if ((local_58 == 0.0) && (!NAN(local_58))) {
          local_58 = 1.0;
        }
        local_50 = (double)N_VDotProd(local_a0,local_98);
        local_50 = local_50 / local_58;
        if ((local_d4 == 0) && (*local_d0 != 0)) {
          N_VLinearSum(local_40,local_50,local_90,local_98,local_20);
        }
        else {
          local_138 = 1.0;
          local_158 = local_20;
          local_130 = local_40;
          local_150 = local_90;
          local_148 = local_98;
          local_128 = local_50;
          N_VLinearCombination(3,&local_138,&local_158,local_20);
        }
        N_VLinearSum(0x3ff0000000000000,-local_50,local_98,local_a0,local_88);
        dVar3 = (double)N_VDotProd(local_88,local_88);
        if (0.0 < dVar3) {
          dVar3 = (double)N_VDotProd(local_88,local_88);
          local_170 = sqrt(dVar3);
        }
        else {
          local_170 = 0.0;
        }
        local_78 = local_170;
        *local_110 = local_170;
        if (local_170 <= local_30) {
          local_c4 = 1;
          break;
        }
        local_60 = (double)N_VDotProd(local_88,local_80);
        local_138 = (local_60 / local_68) * (local_40 / local_50);
        local_158 = local_90;
        local_130 = -local_40 * (local_60 / local_68);
        local_150 = local_a8;
        local_128 = 1.0;
        local_148 = local_88;
        local_48 = local_138;
        N_VLinearCombination(3,&local_138,&local_158,local_90);
        local_68 = local_60;
      }
      if ((local_c4 != 1) && (local_70 <= local_78)) {
        *local_d0 = 0;
        *(undefined4 *)(*local_10 + 0x18) = 0x322;
        return *(int *)(*local_10 + 0x18);
      }
      if (local_bc != 0) {
        N_VDiv(local_20,local_f0,local_20);
      }
      if (local_b8 != 0) {
        local_11c = (*local_108)(local_30,local_e8,local_20,local_b0,2);
        if (local_11c != 0) {
          *local_d0 = 0;
          uVar2 = 0x325;
          if (local_11c < 0) {
            uVar2 = 0xfffffcd8;
          }
          *(undefined4 *)(*local_10 + 0x18) = uVar2;
          return *(int *)(*local_10 + 0x18);
        }
        N_VScale(0x3ff0000000000000,local_b0,local_20);
      }
      *local_d0 = 0;
      if (local_c4 == 1) {
        *(undefined4 *)(*local_10 + 0x18) = 0;
      }
      else {
        *(undefined4 *)(*local_10 + 0x18) = 0x321;
      }
      local_4 = *(int *)(*local_10 + 0x18);
    }
    else {
      *local_d0 = 0;
      *(undefined4 *)(*local_10 + 0x18) = 0;
      local_4 = *(int *)(*local_10 + 0x18);
    }
  }
  else {
    *local_d0 = 0;
    *(undefined4 *)(*in_RDI + 0x18) = 0xffffd8f2;
    local_4 = -0x270e;
  }
  return local_4;
}

Assistant:

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                          N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  sunrealtype alpha, beta, omega, omega_denom, beta_num, beta_denom, r_norm, rho;
  N_Vector r_star, r, p, q, u, Ap, vtemp;
  sunbooleantype preOnLeft, preOnRight, scale_x, scale_b, converged;
  sunbooleantype* zeroguess;
  int l, l_max;
  void *A_data, *P_data;
  N_Vector sx, sb;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* res_norm;
  int* nli;
  int status;

  /* local variables for fused vector operations */
  sunrealtype cv[3];
  N_Vector Xv[3];

  /* Make local shortcuts to solver variables. */
  l_max     = SPBCGS_CONTENT(S)->maxl;
  r_star    = SPBCGS_CONTENT(S)->r_star;
  r         = SPBCGS_CONTENT(S)->r;
  p         = SPBCGS_CONTENT(S)->p;
  q         = SPBCGS_CONTENT(S)->q;
  u         = SPBCGS_CONTENT(S)->u;
  Ap        = SPBCGS_CONTENT(S)->Ap;
  vtemp     = SPBCGS_CONTENT(S)->vtemp;
  sb        = SPBCGS_CONTENT(S)->s1;
  sx        = SPBCGS_CONTENT(S)->s2;
  A_data    = SPBCGS_CONTENT(S)->ATData;
  P_data    = SPBCGS_CONTENT(S)->PData;
  atimes    = SPBCGS_CONTENT(S)->ATimes;
  psolve    = SPBCGS_CONTENT(S)->Psolve;
  zeroguess = &(SPBCGS_CONTENT(S)->zeroguess);
  nli       = &(SPBCGS_CONTENT(S)->numiters);
  res_norm  = &(SPBCGS_CONTENT(S)->resnorm);

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* set sunbooleantype flags for internal solver options */
  preOnLeft = ((PRETYPE(S) == SUN_PREC_LEFT) || (PRETYPE(S) == SUN_PREC_BOTH));
  preOnRight = ((PRETYPE(S) == SUN_PREC_RIGHT) || (PRETYPE(S) == SUN_PREC_BOTH));
  scale_x = (sx != NULL);
  scale_b = (sb != NULL);

  SUNLogInfo(S->sunctx->logger, "linear-solver", "solver = spbcgs");

  SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

  /* Check for unsupported use case */
  if (preOnRight && !(*zeroguess))
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_ERR_ARG_INCOMPATIBLE;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "status = failed unsupported configuration");

    return SUN_ERR_ARG_INCOMPATIBLE;
  }

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!(preOnLeft || preOnRight) || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set r_star to initial (unscaled) residual r_0 = b - A*x_0 */

  if (*zeroguess)
  {
    N_VScale(ONE, b, r_star);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, r_star);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = %d", status);

      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, r_star, r_star);
    SUNCheckLastErr();
  }

  /* Apply left preconditioner and b-scaling to r_star = r_0 */

  if (preOnLeft)
  {
    status = psolve(P_data, r_star, r, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed preconditioner solve, retval = %d", status);

      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, r_star, r);
    SUNCheckLastErr();
  }

  if (scale_b)
  {
    N_VProd(sb, r, r_star);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, r, r_star);
    SUNCheckLastErr();
  }

  /* Initialize beta_denom to the dot product of r0 with r0 */

  beta_denom = N_VDotProd(r_star, r_star);
  SUNCheckLastErr();

  /* Set r_norm to L2 norm of r_star = sb P1_inv r_0, and
     return if small */

  *res_norm = r_norm = rho = SUNRsqrt(beta_denom);

  if (r_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "cur-iter = 0, res-norm = %.16g, status = success", *res_norm);

    return (LASTFLAG(S));
  }

  SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
             "cur-iter = 0, res-norm = %.16g, status = continue", *res_norm);

  /* Copy r_star to r and p */

  N_VScale(ONE, r_star, r);
  SUNCheckLastErr();
  N_VScale(ONE, r_star, p);
  SUNCheckLastErr();

  /* Set x = sx x if non-zero guess */
  if (scale_x && !(*zeroguess))
  {
    N_VProd(sx, x, x);
    SUNCheckLastErr();
  }

  /* Begin main iteration loop */

  for (l = 0; l < l_max; l++)
  {
    SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

    (*nli)++;

    /* Generate Ap = A-tilde p, where A-tilde = sb P1_inv A P2_inv sx_inv */

    /*   Apply x-scaling: vtemp = sx_inv p */

    if (scale_x)
    {
      N_VDiv(p, sx, vtemp);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, p, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv p */

    if (preOnRight)
    {
      N_VScale(ONE, vtemp, Ap);
      SUNCheckLastErr();
      status = psolve(P_data, Ap, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }

    /*   Apply A: Ap = A P2_inv sx_inv p */

    status = atimes(A_data, vtemp, Ap);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = ", status);

      return (LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft)
    {
      status = psolve(P_data, Ap, vtemp, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, Ap, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply b-scaling: Ap = sb P1_inv A P2_inv sx_inv p */

    if (scale_b)
    {
      N_VProd(sb, vtemp, Ap);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, vtemp, Ap);
      SUNCheckLastErr();
    }

    /* Calculate alpha = <r,r_star>/<Ap,r_star> */

    alpha = N_VDotProd(Ap, r_star);
    SUNCheckLastErr();
    alpha = beta_denom / alpha;

    /* Update q = r - alpha*Ap = r - alpha*(sb P1_inv A P2_inv sx_inv p) */

    N_VLinearSum(ONE, r, -alpha, Ap, q);
    SUNCheckLastErr();

    /* Generate u = A-tilde q */

    /*   Apply x-scaling: vtemp = sx_inv q */

    if (scale_x)
    {
      N_VDiv(q, sx, vtemp);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, q, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv q */

    if (preOnRight)
    {
      N_VScale(ONE, vtemp, u);
      SUNCheckLastErr();
      status = psolve(P_data, u, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }

    /*   Apply A: u = A P2_inv sx_inv u */

    status = atimes(A_data, vtemp, u);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = %d", status);

      return (LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft)
    {
      status = psolve(P_data, u, vtemp, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, u, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply b-scaling: u = sb P1_inv A P2_inv sx_inv u */

    if (scale_b)
    {
      N_VProd(sb, vtemp, u);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, vtemp, u);
      SUNCheckLastErr();
    }

    /* Calculate omega = <u,q>/<u,u> */

    omega_denom = N_VDotProd(u, u);
    SUNCheckLastErr();
    if (omega_denom == ZERO) { omega_denom = ONE; }
    omega = N_VDotProd(u, q);
    SUNCheckLastErr();
    omega /= omega_denom;

    /* Update x = x + alpha*p + omega*q */
    if (l == 0 && *zeroguess)
    {
      N_VLinearSum(alpha, p, omega, q, x);
      SUNCheckLastErr();
    }
    else
    {
      cv[0] = ONE;
      Xv[0] = x;

      cv[1] = alpha;
      Xv[1] = p;

      cv[2] = omega;
      Xv[2] = q;

      SUNCheckCall(N_VLinearCombination(3, cv, Xv, x));
    }

    /* Update the residual r = q - omega*u */

    N_VLinearSum(ONE, q, -omega, u, r);
    SUNCheckLastErr();

    /* Set rho = norm(r) and check convergence */

    *res_norm = rho = SUNRsqrt(N_VDotProd(r, r));
    SUNCheckLastErr();

    SUNLogInfo(S->sunctx->logger, "linear-iterate",
               "cur-iter = %i, res-norm = %.16g", *nli, *res_norm);

    if (rho <= delta)
    {
      converged = SUNTRUE;
      break;
    }

    /* Not yet converged, continue iteration */
    /* Update beta = <rnew,r_star> / <rold,r_start> * alpha / omega */

    beta_num = N_VDotProd(r, r_star);
    SUNCheckLastErr();
    beta = ((beta_num / beta_denom) * (alpha / omega));

    /* Update p = r + beta*(p - omega*Ap) = beta*p - beta*omega*Ap + r */
    cv[0] = beta;
    Xv[0] = p;

    cv[1] = -alpha * (beta_num / beta_denom);
    Xv[1] = Ap;

    cv[2] = ONE;
    Xv[2] = r;

    SUNCheckCall(N_VLinearCombination(3, cv, Xv, p));

    /* update beta_denom for next iteration */
    beta_denom = beta_num;

    SUNLogInfoIf(l < l_max - 1, S->sunctx->logger, "end-linear-iterate",
                 "status = continue");
  }

  /* Main loop finished */

  if ((converged == SUNTRUE) || (rho < r_norm))
  {
    /* Apply the x-scaling and right preconditioner: x = P2_inv sx_inv x */

    if (scale_x)
    {
      N_VDiv(x, sx, x);
      SUNCheckLastErr();
    }
    if (preOnRight)
    {
      status = psolve(P_data, x, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed preconditioner solve, retval = %d", status);

        return (LASTFLAG(S));
      }
      N_VScale(ONE, vtemp, x);
      SUNCheckLastErr();
    }

    *zeroguess = SUNFALSE;
    if (converged == SUNTRUE)
    {
      SUNLogInfo(S->sunctx->logger, "end-linear-iterate", "status = success");

      LASTFLAG(S) = SUN_SUCCESS;
    }
    else
    {
      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed residual reduced");

      LASTFLAG(S) = SUNLS_RES_REDUCED;
    }
    return (LASTFLAG(S));
  }
  else
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_CONV_FAIL;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "status = failed max iterations");

    return (LASTFLAG(S));
  }
}